

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

uint16_t elf_getshndx(GlobalVars *gv,Symbol *sym,uint8_t symtype)

{
  uint16_t uVar1;
  
  switch(sym->type) {
  case '\0':
    uVar1 = 0;
    break;
  case '\x01':
    uVar1 = 0xfff1;
    break;
  case '\x02':
    if (2 < symtype) {
      ierror("elf_getshndx(): %s is relocatable, but not a function or object (type %d)",sym->name,
             (ulong)symtype);
    }
    uVar1 = (uint16_t)sym->relsect->lnksec->index;
    break;
  case '\x03':
    uVar1 = 0xfff2;
    break;
  case '\x04':
    uVar1 = 0;
    error(0x21,fff[gv->dest_format]->tname,sym->name,sym_bind[sym->bind],sym_type[4],
          sym_info[sym->info]);
    break;
  default:
    uVar1 = 0;
    ierror("elf_getshndx(): Illegal symbol type: %d");
  }
  return uVar1;
}

Assistant:

uint16_t elf_getshndx(struct GlobalVars *gv,
                      struct Symbol *sym,uint8_t symtype)
{
  uint16_t shndx = SHN_UNDEF;

  switch (sym->type) {
    case SYM_INDIR:
      /* can't reproduce unsupported symbol type */
      error(33,fff[gv->dest_format]->tname,sym->name,sym_bind[sym->bind],
            sym_type[sym->type],sym_info[sym->info]);
    case SYM_UNDEF:
      shndx = SHN_UNDEF;
      break;
    case SYM_ABS:
      shndx = SHN_ABS;
      break;
    case SYM_RELOC:
      if (symtype > STT_FUNC)
        ierror("elf_getshndx(): %s is relocatable, but not a "
               "function or object (type %d)",sym->name,(int)symtype);
      shndx = (uint16_t)sym->relsect->lnksec->index;
      break;
    case SYM_COMMON:
      shndx = SHN_COMMON;
      break;
    default:
      ierror("elf_getshndx(): Illegal symbol type: %d",(int)sym->type);
      break;
  }
  return shndx;
}